

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::lineTo(QPainterPath *this,QPointF *p)

{
  Element *pEVar1;
  QPainterPathPrivate *this_00;
  long lVar2;
  bool bVar3;
  byte bVar4;
  long in_FS_OFFSET;
  Element local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = hasValidCoords(*p);
  if (bVar3) {
    ensureData(this);
    detach(this);
    this_00 = (this->d_ptr).d.ptr;
    QPainterPathPrivate::maybeMoveTo(this_00);
    pEVar1 = (this_00->elements).d.ptr + (this_00->elements).d.size + -1;
    local_38.x = pEVar1->x;
    local_38.y = pEVar1->y;
    bVar3 = qFuzzyCompare(p,(QPointF *)&local_38);
    if (!bVar3) {
      local_38.x = p->xp;
      local_38.y = p->yp;
      local_38.type = LineToElement;
      local_38._20_4_ = 0xaaaaaaaa;
      QList<QPainterPath::Element>::emplaceBack<QPainterPath::Element_const&>
                (&this_00->elements,&local_38);
      lVar2 = (this_00->elements).d.size;
      if (lVar2 == 3) {
        bVar4 = 0x10;
      }
      else if (lVar2 == 4) {
        bVar3 = QPainterPathPrivate::isClosed(this_00);
        bVar4 = bVar3 << 4;
      }
      else {
        bVar4 = 0;
      }
      this_00->field_0x84 = this_00->field_0x84 & 0xef | bVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::lineTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::lineTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::lineTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());
    d->maybeMoveTo();
    if (p == QPointF(d->elements.constLast()))
        return;
    Element elm = { p.x(), p.y(), LineToElement };
    d->elements.append(elm);

    d->convex = d->elements.size() == 3 || (d->elements.size() == 4 && d->isClosed());
}